

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestResourceGroupsLexer.cxx
# Opt level: O1

void cmCTestResourceGroups_yyrestart(FILE *input_file,yyscan_t yyscanner)

{
  long lVar1;
  undefined1 *puVar2;
  YY_BUFFER_STATE pyVar3;
  
  if ((*(long *)((long)yyscanner + 0x28) == 0) ||
     (*(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8) == 0)) {
    cmCTestResourceGroups_yyensure_buffer_stack(yyscanner);
    pyVar3 = cmCTestResourceGroups_yy_create_buffer
                       (*(FILE **)((long)yyscanner + 8),0x4000,yyscanner);
    *(YY_BUFFER_STATE *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8)
         = pyVar3;
  }
  if (*(long *)((long)yyscanner + 0x28) == 0) {
    pyVar3 = (YY_BUFFER_STATE)0x0;
  }
  else {
    pyVar3 = *(YY_BUFFER_STATE *)
              (*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8);
  }
  cmCTestResourceGroups_yy_init_buffer(pyVar3,input_file,yyscanner);
  lVar1 = *(long *)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8);
  *(undefined4 *)((long)yyscanner + 0x34) = *(undefined4 *)(lVar1 + 0x1c);
  puVar2 = *(undefined1 **)(lVar1 + 0x10);
  *(undefined1 **)((long)yyscanner + 0x40) = puVar2;
  *(undefined1 **)((long)yyscanner + 0x80) = puVar2;
  *(undefined8 *)((long)yyscanner + 8) =
       **(undefined8 **)(*(long *)((long)yyscanner + 0x28) + *(long *)((long)yyscanner + 0x18) * 8);
  *(undefined1 *)((long)yyscanner + 0x30) = *puVar2;
  return;
}

Assistant:

void yyrestart  (FILE * input_file , yyscan_t yyscanner)
{
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;

	if ( ! YY_CURRENT_BUFFER ){
        yyensure_buffer_stack (yyscanner);
		YY_CURRENT_BUFFER_LVALUE =
            yy_create_buffer( yyin, YY_BUF_SIZE , yyscanner);
	}

	yy_init_buffer( YY_CURRENT_BUFFER, input_file , yyscanner);
	yy_load_buffer_state( yyscanner );
}